

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O3

png_uint_32
png_get_eXIf_1(png_const_structrp png_ptr,png_const_inforp info_ptr,png_uint_32 *num_exif,
              png_bytep *exif)

{
  png_uint_32 pVar1;
  
  pVar1 = 0;
  if (((info_ptr != (png_const_inforp)0x0 && png_ptr != (png_const_structrp)0x0) &&
      (exif != (png_bytep *)0x0)) && ((info_ptr->valid & 0x10000) != 0)) {
    *num_exif = info_ptr->num_exif;
    *exif = info_ptr->exif;
    pVar1 = 0x10000;
  }
  return pVar1;
}

Assistant:

png_uint_32 PNGAPI
png_get_eXIf_1(png_const_structrp png_ptr, png_const_inforp info_ptr,
    png_uint_32 *num_exif, png_bytep *exif)
{
   png_debug1(1, "in %s retrieval function", "eXIf");

   if (png_ptr != NULL && info_ptr != NULL &&
       (info_ptr->valid & PNG_INFO_eXIf) != 0 && exif != NULL)
   {
      *num_exif = info_ptr->num_exif;
      *exif = info_ptr->exif;
      return (PNG_INFO_eXIf);
   }

   return (0);
}